

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::anon_unknown_1::ModifyAfterWithBufferSubDataCase::testWithBufferSize
          (ModifyAfterWithBufferSubDataCase *this,
          UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
          *result,int bufferSize)

{
  RenderContext *pRVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  deUint64 dVar6;
  deUint64 dVar7;
  uint begin;
  int iVar8;
  bool bVar9;
  
  begin = bufferSize / 4 + 0xfU & 0xfffffff0;
  pRVar1 = ((this->
            super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
            ).
            super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
            .super_TestCase.m_context)->m_renderCtx;
  iVar3 = (*pRVar1->_vptr_RenderContext[3])(pRVar1,result,(long)(bufferSize * 3) % 4 & 0xffffffff);
  iVar8 = 2;
  iVar4 = bufferSize / 2;
  uVar2 = begin;
  if (this->m_partialUpload == false) {
    iVar4 = bufferSize;
    uVar2 = 0;
  }
  uVar5 = iVar4 + 0xfU & 0xfffffff0;
  if (this->m_repeatedUpload != false) {
    while (bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
      (**(code **)(CONCAT44(extraout_var,iVar3) + 0x168))
                (0x8892,(long)(int)uVar2,(long)(int)uVar5,
                 (this->
                 super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                 ).m_zeroData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
      ::drawBufferRange(&this->
                         super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                        ,begin,(bufferSize * 3) / 4 + 0xfU & 0xfffffff0);
    }
  }
  dVar6 = deGetMicroseconds();
  (**(code **)(CONCAT44(extraout_var,iVar3) + 0x168))
            (0x8892,(long)(int)uVar2,(long)(int)uVar5,
             (this->
             super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
             ).m_zeroData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar7 = deGetMicroseconds();
  (result->duration).totalDuration = dVar7 - dVar6;
  (result->duration).fitResponseDuration = dVar7 - dVar6;
  result->writtenSize = uVar5;
  return;
}

Assistant:

void ModifyAfterWithBufferSubDataCase::testWithBufferSize (UploadSampleResult<SingleOperationDuration>& result, int bufferSize)
{
	// always draw the same amount to make compares between cases sensible
	const int					drawStart			= deAlign32(bufferSize / 4, 4*4);
	const int					drawEnd				= deAlign32(bufferSize * 3 / 4, 4*4);

	const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();
	const int					subdataOffset		= deAlign32((m_partialUpload) ? (bufferSize / 4) : (0), 4*4);
	const int					subdataSize			= deAlign32((m_partialUpload) ? (bufferSize / 2) : (bufferSize), 4*4);
	deUint64					startTime;
	deUint64					endTime;

	// make upload-draw stream
	if (m_repeatedUpload)
	{
		for (int repeatNdx = 0; repeatNdx < NUM_REPEATS; ++repeatNdx)
		{
			gl.bufferSubData(GL_ARRAY_BUFFER, subdataOffset, subdataSize, &m_zeroData[0]);
			drawBufferRange(drawStart, drawEnd);
		}
	}

	// test upload
	startTime = deGetMicroseconds();
	gl.bufferSubData(GL_ARRAY_BUFFER, subdataOffset, subdataSize, &m_zeroData[0]);
	endTime = deGetMicroseconds();

	result.duration.totalDuration = endTime - startTime;
	result.duration.fitResponseDuration = result.duration.totalDuration;
	result.writtenSize = subdataSize;
}